

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O0

void __thiscall rcg::CPort::Read(CPort *this,void *buffer,int64_t addr,int64_t length)

{
  element_type *peVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined8 uVar4;
  ulong in_RCX;
  uint64_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ostringstream out;
  GC_ERROR err;
  int retry;
  size_t size;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000370;
  string *in_stack_00000378;
  GenTLException *in_stack_00000380;
  string *in_stack_fffffffffffffd78;
  allocator *msg;
  GenTLException *in_stack_fffffffffffffd80;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [39];
  undefined1 local_1d9;
  ostringstream local_1a8 [376];
  int local_30;
  int local_2c;
  size_t local_28;
  ulong local_20;
  uint64_t local_18;
  void *local_10;
  
  local_28 = 0;
  if (**(long **)(in_RDI + 0x18) == 0) {
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,"CPort::Read(): Port has been closed",&local_229);
    GenTLException::GenTLException(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    __cxa_throw(uVar4,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  local_2c = 1;
  local_30 = -0x3e9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (local_30 != 0 && 0 < local_2c) {
    local_2c = local_2c + -1;
    local_28 = local_20;
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1225ac);
    local_30 = (*peVar1->GCReadPort)
                         ((PORT_HANDLE)**(undefined8 **)(in_RDI + 0x18),local_18,local_10,&local_28)
    ;
  }
  if (local_30 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"CPort::Read(address=0x");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_18);
    poVar2 = std::operator<<(poVar2,", length=");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,local_20);
    std::operator<<(poVar2,")");
    local_1d9 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    GenTLException::GenTLException(in_stack_00000380,in_stack_00000378,in_stack_00000370);
    local_1d9 = 0;
    __cxa_throw(uVar4,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (local_28 == 0) {
    local_202 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    msg = &local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"CPort::Read(): Returned size is 0",msg);
    GenTLException::GenTLException(in_stack_fffffffffffffd80,(string *)msg);
    local_202 = 0;
    __cxa_throw(uVar4,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  while (local_28 < local_20) {
    *(undefined1 *)((long)local_10 + local_28) = 0;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CPort::Read(void *buffer, int64_t addr, int64_t length)
{
  size_t size=0;

  if (*port != 0)
  {
    int retry=1;
    GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

    while (err != GenTL::GC_ERR_SUCCESS && retry > 0)
    {
      retry--;

      size=static_cast<size_t>(length);
      err=gentl->GCReadPort(*port, static_cast<uint64_t>(addr), buffer, &size);
    }

    if (err != GenTL::GC_ERR_SUCCESS)
    {
      std::ostringstream out;
      out << "CPort::Read(address=0x" << std::hex << addr << ", length=" <<
        std::dec << static_cast<size_t>(length) << ")";

      throw GenTLException(out.str(), gentl);
    }

    if (size == 0)
    {
      throw GenTLException("CPort::Read(): Returned size is 0");
    }

    while (size < static_cast<size_t>(length))
    {
      reinterpret_cast<uint8_t *>(buffer)[size++]=0;
    }
  }
  else
  {
    throw GenTLException("CPort::Read(): Port has been closed");
  }
}